

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_auth_client.c
# Opt level: O0

DEVICE_AUTH_TYPE iothub_device_auth_get_type(IOTHUB_SECURITY_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  DEVICE_AUTH_TYPE result;
  IOTHUB_SECURITY_HANDLE handle_local;
  
  if (handle == (IOTHUB_SECURITY_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                ,"iothub_device_auth_get_type",0x105,1,"Invalid handle specified");
    }
    l._4_4_ = AUTH_TYPE_UNKNOWN;
  }
  else {
    l._4_4_ = handle->cred_type;
  }
  return l._4_4_;
}

Assistant:

DEVICE_AUTH_TYPE iothub_device_auth_get_type(IOTHUB_SECURITY_HANDLE handle)
{
    DEVICE_AUTH_TYPE result;
    if (handle == NULL)
    {
        LogError("Invalid handle specified");
        result = AUTH_TYPE_UNKNOWN;
    }
    else
    {
        result = handle->cred_type;
    }
    return result;
}